

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortDnaSequence.cpp
# Opt level: O0

double __thiscall ShortDnaSequence::qualityCorrect(ShortDnaSequence *this,size_t pos)

{
  ShortDnaSequence *in_RSI;
  __type _Var1;
  double in_stack_ffffffffffffffe8;
  
  qualityChar(in_RSI,(size_t)in_stack_ffffffffffffffe8);
  _Var1 = std::pow<int,double>((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
  return 1.0 - _Var1;
}

Assistant:

double ShortDnaSequence::qualityCorrect(size_t pos) const {
    return 1 - pow(10, -(qualityChar(pos)-33)/10.0);
}